

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O1

BSDF * __thiscall
pbrt::SubsurfaceMaterial::GetBSDF<pbrt::UniversalTextureEvaluator>
          (BSDF *__return_storage_ptr__,SubsurfaceMaterial *this,TextureEvalContext *param_3,
          undefined8 param_4,int *param_5)

{
  undefined8 uVar1;
  bool bVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 uVar3;
  uintptr_t iptr;
  Float __x;
  undefined1 auVar4 [16];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar5 [16];
  undefined1 auVar8 [64];
  UniversalTextureEvaluator local_d1;
  BxDFHandle local_d0;
  uintptr_t local_c8;
  uintptr_t local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  
  local_c0 = (this->uRoughness).
             super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
             .bits;
  local_78._0_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.x;
  local_78._4_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.y;
  uStack_70 = *(undefined8 *)&(param_3->p).super_Tuple3<pbrt::Point3,_float>.z;
  uStack_68._0_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_68._4_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_60._0_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
  uStack_60._4_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_58 = *(undefined8 *)&(param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_50 = *(undefined8 *)&(param_3->uv).super_Tuple2<pbrt::Point2,_float>.y;
  uStack_48._0_4_ = param_3->dudy;
  uStack_48._4_4_ = param_3->dvdx;
  uStack_40._0_4_ = param_3->dvdy;
  uStack_40._4_4_ = param_3->faceIndex;
  __x = UniversalTextureEvaluator::operator()(&local_d1,(FloatTextureHandle)&local_c0,*param_3);
  local_c8 = (this->vRoughness).
             super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
             .bits;
  local_b8._0_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.x;
  local_b8._4_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.y;
  uStack_b0 = *(undefined8 *)&(param_3->p).super_Tuple3<pbrt::Point3,_float>.z;
  uStack_a8._0_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_a8._4_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_a0._0_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
  uStack_a0._4_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_98 = *(undefined8 *)&(param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_90 = *(undefined8 *)&(param_3->uv).super_Tuple2<pbrt::Point2,_float>.y;
  uStack_88._0_4_ = param_3->dudy;
  uStack_88._4_4_ = param_3->dvdx;
  uStack_80._0_4_ = param_3->dvdy;
  uStack_80._4_4_ = param_3->faceIndex;
  auVar6._0_4_ = UniversalTextureEvaluator::operator()
                           (&local_d1,(FloatTextureHandle)&local_c8,*param_3);
  auVar6._4_60_ = extraout_var_02;
  auVar4 = auVar6._0_16_;
  uVar3 = extraout_var;
  if (this->remapRoughness == true) {
    if (__x < 0.0) {
      auVar7._0_4_ = sqrtf(__x);
      auVar7._4_60_ = extraout_var_03;
      auVar4 = ZEXT416((uint)auVar6._0_4_);
      auVar5 = auVar7._0_16_;
      uVar3 = extraout_var_00;
    }
    else {
      auVar5 = vsqrtss_avx(ZEXT416((uint)__x),ZEXT416((uint)__x));
    }
    if (auVar4._0_4_ < 0.0) {
      auVar8._0_4_ = sqrtf(auVar4._0_4_);
      auVar8._4_60_ = extraout_var_04;
      auVar5 = ZEXT416(auVar5._0_4_);
      auVar4 = auVar8._0_16_;
      uVar3 = extraout_var_01;
    }
    else {
      auVar4 = vsqrtss_avx(auVar4,auVar4);
    }
  }
  else {
    auVar5 = ZEXT416((uint)__x);
  }
  auVar5 = vmaxss_avx(auVar5,SUB6416(ZEXT464(0x38d1b717),0));
  auVar4 = vmaxss_avx(auVar4,SUB6416(ZEXT464(0x38d1b717),0));
  uVar1 = vcmpss_avx512f(ZEXT416((uint)this->eta),ZEXT416(0x3f800000),0);
  bVar2 = (bool)((byte)uVar1 & 1);
  *param_5 = (uint)bVar2 * 0x3f8020c5 + (uint)!bVar2 * (int)this->eta;
  *(ulong *)(param_5 + 1) = CONCAT44(uVar3,auVar5._0_4_) | (ulong)auVar4._0_4_ << 0x20;
  local_d0.
  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
  .bits = (TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
           )((ulong)param_5 | 0x5000000000000);
  BSDF::BSDF(__return_storage_ptr__,(Vector3f *)(param_3 + 1),(Normal3f *)&param_3[1].dpdx,
             (Normal3f *)&param_3[1].dpdy,(Vector3f *)&param_3[1].uv,&local_d0,this->eta);
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU BSDF GetBSDF(TextureEvaluator texEval, const MaterialEvalContext &ctx,
                              SampledWavelengths &lambda,
                              DielectricInterfaceBxDF *bxdf) const {
        // Initialize BSDF for _SubsurfaceMaterial_

        Float urough = texEval(uRoughness, ctx), vrough = texEval(vRoughness, ctx);
        if (remapRoughness) {
            urough = TrowbridgeReitzDistribution::RoughnessToAlpha(urough);
            vrough = TrowbridgeReitzDistribution::RoughnessToAlpha(vrough);
        }
        TrowbridgeReitzDistribution distrib(urough, vrough);

        // Initialize _bsdf_ for smooth or rough dielectric
        *bxdf = DielectricInterfaceBxDF(eta, distrib);
        return BSDF(ctx.wo, ctx.n, ctx.ns, ctx.dpdus, bxdf, eta);
    }